

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.hpp
# Opt level: O1

Nullable<LiteScript::Variable> * __thiscall
LiteScript::Nullable<LiteScript::Variable>::operator=
          (Nullable<LiteScript::Variable> *this,Nullable<LiteScript::Variable> *v)

{
  bool bVar1;
  
  if (this != v) {
    if (this->is_null == false) {
      Variable::~Variable((Variable *)this);
    }
    this->is_null = true;
    bVar1 = v->is_null;
    this->is_null = bVar1;
    if (bVar1 == false) {
      Variable::Variable((Variable *)this,(Variable *)v);
    }
  }
  return this;
}

Assistant:

Nullable<T>& operator=(const Nullable<T>& v) {
            if (this == &v)
                return *this;
            this->Nullify();
            if (!(this->is_null = v.is_null)) {
                std::allocator<T> allocator;
                allocator.construct((T *)this->data, *(const T *)v.data);
            }
            return *this;
        }